

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectBlur.cpp
# Opt level: O2

SharedPtr<FontEffect> __thiscall
Rml::FontEffectBlurInstancer::InstanceFontEffect
          (FontEffectBlurInstancer *this,String *param_1,PropertyDictionary *properties)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  Colour<unsigned_char,_255,_false> _colour;
  Property *pPVar3;
  PropertyDictionary *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  float fVar4;
  SharedPtr<FontEffect> SVar5;
  SharedPtr<Rml::FontEffectBlur> font_effect;
  FontEffectBlur *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  pPVar3 = PropertyDictionary::GetProperty(in_RCX,param_1[4].field_2._M_local_buf[0]);
  fVar4 = Property::Get<float>(pPVar3);
  pPVar3 = PropertyDictionary::GetProperty(in_RCX,param_1[4].field_2._M_local_buf[1]);
  _colour = Property::Get<Rml::Colour<unsigned_char,255,false>>(pPVar3);
  ::std::make_shared<Rml::FontEffectBlur>();
  bVar2 = FontEffectBlur::Initialise(local_38,(int)fVar4);
  if (bVar2) {
    FontEffect::SetColour(&local_38->super_FontEffect,_colour);
    _Var1._M_pi = a_Stack_30[0]._M_pi;
    a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_FontEffectInstancer)._vptr_FontEffectInstancer = (_func_int **)local_38;
    (this->super_FontEffectInstancer).properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var1._M_pi;
  }
  else {
    (this->super_FontEffectInstancer)._vptr_FontEffectInstancer = (_func_int **)0x0;
    (this->super_FontEffectInstancer).properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_30);
  SVar5.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar5.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SharedPtr<FontEffect>)
         SVar5.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<FontEffect> FontEffectBlurInstancer::InstanceFontEffect(const String& /*name*/, const PropertyDictionary& properties)
{
	float width = properties.GetProperty(id_width)->Get<float>();
	Colourb color = properties.GetProperty(id_color)->Get<Colourb>();

	auto font_effect = MakeShared<FontEffectBlur>();
	if (font_effect->Initialise(int(width)))
	{
		font_effect->SetColour(color);
		return font_effect;
	}

	return nullptr;
}